

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O0

bool __thiscall
Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::operator==
          (Simplex_tree<Simplex_tree_options_stable_simplex_handles> *this,
          Simplex_tree<Simplex_tree_options_stable_simplex_handles> *st2)

{
  Simplex_tree<Simplex_tree_options_stable_simplex_handles> *st2_local;
  Simplex_tree<Simplex_tree_options_stable_simplex_handles> *this_local;
  
  if ((this->null_vertex_ == st2->null_vertex_) &&
     (((this->dimension_ == st2->dimension_ || ((this->dimension_to_be_lowered_ & 1U) != 0)) ||
      ((st2->dimension_to_be_lowered_ & 1U) != 0)))) {
    this_local._7_1_ =
         rec_equal<Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>,boost::container::map<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>>,std::less<int>,void,void>>>
                   (this,&this->root_,&st2->root_);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool operator==(const Simplex_tree<OtherSimplexTreeOptions>& st2) const {
    if ((null_vertex_ != st2.null_vertex_) ||
        (dimension_ != st2.dimension_ && !dimension_to_be_lowered_ && !st2.dimension_to_be_lowered_))
      return false;
    return rec_equal(&root_, &st2.root_);
  }